

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall ON_4dRect::SubtractRect(ON_4dRect *this,ON_4dRect *rect1,ON_4dRect *rect2)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  
  if (rect1 != (ON_4dRect *)0x0) {
    dVar4 = rect1->left;
    dVar1 = rect1->top;
    dVar2 = rect1->bottom;
    this->right = rect1->right;
    this->bottom = dVar2;
    this->left = dVar4;
    this->top = dVar1;
    bVar3 = IsRectEmpty(rect1);
    if (rect2 != (ON_4dRect *)0x0 && !bVar3) {
      bVar3 = IsRectEmpty(rect2);
      if (!bVar3) {
        if ((rect2->top <= rect1->top) && (rect1->bottom <= rect2->bottom)) {
          dVar4 = this->left;
          if (dVar4 < rect2->right) {
            dVar4 = ON_Min(rect2->right,this->right);
            this->left = dVar4;
          }
          if (rect2->left < this->right) {
            dVar4 = ON_Max(dVar4,rect2->left);
            this->right = dVar4;
          }
        }
        if ((rect2->left <= rect1->left) && (rect1->right <= rect2->right)) {
          dVar4 = this->top;
          if (dVar4 < rect2->bottom) {
            dVar4 = ON_Min(rect2->bottom,this->bottom);
            this->top = dVar4;
          }
          if (rect2->top < this->bottom) {
            dVar4 = ON_Max(dVar4,rect2->top);
            this->bottom = dVar4;
          }
        }
      }
    }
  }
  return rect1 != (ON_4dRect *)0x0;
}

Assistant:

bool ON_4dRect::SubtractRect(const ON_4dRect* rect1, const ON_4dRect* rect2)
{
	if (rect1 == nullptr)
		return false;

	*this = *rect1;

	if (rect1->IsRectEmpty() || rect2 == nullptr || rect2->IsRectEmpty())
	{
		return true;
	}

	if (rect2->top <= rect1->top && rect2->bottom >= rect1->bottom)
	{
		if (left < rect2->right)
		{
			left = ON_Min(rect2->right, right);
		}
		if (right > rect2->left)
		{
			right = ON_Max(left, rect2->left);
		}
	}

	if (rect2->left <= rect1->left && rect2->right >= rect1->right)
	{
		if (top < rect2->bottom)
		{
			top = ON_Min(rect2->bottom, bottom);
		}
		if (bottom > rect2->top)
		{
			bottom = ON_Max(top, rect2->top);
		}
	}

	return true;
}